

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O0

void mspace_free(mspace msp,void *mem)

{
  malloc_tree_chunk *pmVar1;
  malloc_tree_chunk *pmVar2;
  int iVar3;
  uint uVar4;
  mstate pmVar5;
  size_t __len;
  ulong uVar6;
  ulong *puVar7;
  tchunkptr pmVar8;
  size_t *psVar9;
  long lVar10;
  byte bVar11;
  bool bVar12;
  tchunkptr F_5;
  tchunkptr *C;
  size_t K_1;
  tchunkptr T;
  uint K;
  uint X;
  bindex_t I_3;
  tbinptr *H_2;
  tchunkptr tp;
  mchunkptr F_4;
  mchunkptr B_2;
  bindex_t I_2;
  tchunkptr C1_1;
  tchunkptr C0_1;
  tbinptr *H_1;
  tchunkptr *CP_1;
  tchunkptr *RP_1;
  tchunkptr F_3;
  tchunkptr R_1;
  tchunkptr XP_1;
  tchunkptr TP_1;
  bindex_t I_1;
  mchunkptr B_1;
  mchunkptr F_2;
  size_t nsize;
  size_t dsize;
  size_t tsize;
  tchunkptr C1;
  tchunkptr C0;
  tbinptr *H;
  tchunkptr *CP;
  tchunkptr *RP;
  tchunkptr F_1;
  tchunkptr R;
  tchunkptr XP;
  tchunkptr TP;
  bindex_t I;
  mchunkptr B;
  mchunkptr F;
  mchunkptr prev;
  size_t prevsize;
  mchunkptr next;
  size_t psize;
  mstate fm;
  mchunkptr p;
  void *mem_local;
  mspace msp_local;
  
  if (mem == (void *)0x0) {
    return;
  }
  fm = (mstate)((long)mem + -0x10);
  bVar12 = false;
  if (*(mstate *)((long)msp + 0x18) <= fm) {
    bVar12 = (*(ulong *)((long)mem + -8) & 3) != 1;
  }
  if (!bVar12) goto LAB_0016e16a;
  next = (mchunkptr)(*(ulong *)((long)mem + -8) & 0xfffffffffffffff8);
  pmVar5 = (mstate)((long)((malloc_state *)(fm->smallbins + -9))->smallbins + (long)&next[-3].bk);
  if ((*(ulong *)((long)mem + -8) & 1) == 0) {
    uVar6 = *(ulong *)fm;
    if ((*(ulong *)((long)mem + -8) & 3) == 0) {
      __len = (long)&next[1].prev_foot + uVar6;
      iVar3 = munmap((void *)((long)fm - uVar6),__len);
      if (iVar3 != 0) {
        return;
      }
      *(size_t *)((long)msp + 0x358) = *(long *)((long)msp + 0x358) - __len;
      return;
    }
    fm = (mstate)((long)fm - uVar6);
    next = (mchunkptr)((long)&next->prev_foot + uVar6);
    if (fm < *(mstate *)((long)msp + 0x18)) goto LAB_0016e16a;
    if (fm == *(mstate *)((long)msp + 0x20)) {
      if ((pmVar5->dvsize & 3) == 3) {
        *(mchunkptr *)((long)msp + 8) = next;
        pmVar5->dvsize = pmVar5->dvsize & 0xfffffffffffffffe;
        fm->dvsize = (ulong)next | 1;
        *(mchunkptr *)((long)((malloc_state *)(fm->smallbins + -9))->smallbins + (long)&next[-3].bk)
             = next;
        return;
      }
    }
    else if (uVar6 >> 3 < 0x20) {
      pmVar1 = (malloc_tree_chunk *)fm->topsize;
      pmVar2 = (malloc_tree_chunk *)fm->least_addr;
      iVar3 = (int)(uVar6 >> 3);
      bVar12 = true;
      if ((pmVar1 != (malloc_tree_chunk *)((long)msp + (ulong)(uint)(iVar3 << 1) * 8 + 0x48)) &&
         (bVar12 = false, *(malloc_tree_chunk **)((long)msp + 0x18) <= pmVar1)) {
        bVar12 = (mstate)pmVar1->bk == fm;
      }
      if (!bVar12) {
        abort();
      }
      if (pmVar2 == pmVar1) {
        *(uint *)msp = (1 << ((byte)(uVar6 >> 3) & 0x1f) ^ 0xffffffffU) & *msp;
      }
      else {
        bVar12 = true;
        if ((pmVar2 != (malloc_tree_chunk *)((long)msp + (ulong)(uint)(iVar3 << 1) * 8 + 0x48)) &&
           (bVar12 = false, *(malloc_tree_chunk **)((long)msp + 0x18) <= pmVar2)) {
          bVar12 = (mstate)pmVar2->fd == fm;
        }
        if (!bVar12) {
          abort();
        }
        pmVar1->bk = pmVar2;
        pmVar2->fd = pmVar1;
      }
    }
    else {
      pmVar1 = (malloc_tree_chunk *)fm->trim_check;
      if ((mstate)fm->least_addr == fm) {
        CP = (tchunkptr *)&fm->top;
        F_1 = (tchunkptr)fm->top;
        if (F_1 == (tchunkptr)0x0) {
          CP = (tchunkptr *)&fm->dv;
          F_1 = (tchunkptr)fm->dv;
          if (F_1 == (tchunkptr)0x0) goto LAB_0016d376;
        }
        while( true ) {
          H = F_1->child + 1;
          bVar12 = true;
          if (F_1->child[1] == (malloc_tree_chunk *)0x0) {
            H = F_1->child;
            bVar12 = F_1->child[0] != (malloc_tree_chunk *)0x0;
          }
          if (!bVar12) break;
          CP = H;
          F_1 = *H;
        }
        if (CP < *(tchunkptr **)((long)msp + 0x18)) {
          abort();
        }
        *CP = (tchunkptr)0x0;
      }
      else {
        pmVar2 = (malloc_tree_chunk *)fm->topsize;
        F_1 = (tchunkptr)fm->least_addr;
        bVar12 = false;
        if ((*(malloc_tree_chunk **)((long)msp + 0x18) <= pmVar2) &&
           (bVar12 = false, (mstate)pmVar2->bk == fm)) {
          bVar12 = (mstate)F_1->fd == fm;
        }
        if (!bVar12) {
          abort();
        }
        pmVar2->bk = F_1;
        F_1->fd = pmVar2;
      }
LAB_0016d376:
      if (pmVar1 != (malloc_tree_chunk *)0x0) {
        puVar7 = (ulong *)((long)msp + (ulong)(uint)fm->release_checks * 8 + 600);
        if (fm == (mstate)*puVar7) {
          *puVar7 = (ulong)F_1;
          if (F_1 == (tchunkptr)0x0) {
            *(uint *)((long)msp + 4) =
                 (1 << ((byte)(bindex_t)fm->release_checks & 0x1f) ^ 0xffffffffU) &
                 *(uint *)((long)msp + 4);
          }
        }
        else {
          if (pmVar1 < *(malloc_tree_chunk **)((long)msp + 0x18)) {
            abort();
          }
          if ((mstate)pmVar1->child[0] == fm) {
            pmVar1->child[0] = F_1;
          }
          else {
            pmVar1->child[1] = F_1;
          }
        }
        if (F_1 != (tchunkptr)0x0) {
          if (F_1 < *(tchunkptr *)((long)msp + 0x18)) {
            abort();
          }
          F_1->parent = pmVar1;
          pmVar1 = (malloc_tree_chunk *)fm->dv;
          if (pmVar1 != (malloc_tree_chunk *)0x0) {
            if (pmVar1 < *(malloc_tree_chunk **)((long)msp + 0x18)) {
              abort();
            }
            F_1->child[0] = pmVar1;
            pmVar1->parent = F_1;
          }
          pmVar1 = (malloc_tree_chunk *)fm->top;
          if (pmVar1 != (malloc_tree_chunk *)0x0) {
            if (pmVar1 < *(malloc_tree_chunk **)((long)msp + 0x18)) {
              abort();
            }
            F_1->child[1] = pmVar1;
            pmVar1->parent = F_1;
          }
        }
      }
    }
  }
  bVar12 = false;
  if (fm < pmVar5) {
    bVar12 = (pmVar5->dvsize & 1) != 0;
  }
  if (!bVar12) {
LAB_0016e16a:
    abort();
  }
  if ((pmVar5->dvsize & 2) != 0) {
    pmVar5->dvsize = pmVar5->dvsize & 0xfffffffffffffffe;
    fm->dvsize = (ulong)next | 1;
    *(mchunkptr *)((long)((malloc_state *)(fm->smallbins + -9))->smallbins + (long)&next[-3].bk) =
         next;
    goto LAB_0016dcf2;
  }
  if (pmVar5 == *(mstate *)((long)msp + 0x28)) {
    uVar6 = (long)&next->prev_foot + *(long *)((long)msp + 0x10);
    *(ulong *)((long)msp + 0x10) = uVar6;
    *(mstate *)((long)msp + 0x28) = fm;
    fm->dvsize = uVar6 | 1;
    if (fm == *(mstate *)((long)msp + 0x20)) {
      *(undefined8 *)((long)msp + 0x20) = 0;
      *(undefined8 *)((long)msp + 8) = 0;
    }
    if (uVar6 <= *(ulong *)((long)msp + 0x30)) {
      return;
    }
    sys_trim((mstate)msp,0);
    return;
  }
  if (pmVar5 == *(mstate *)((long)msp + 0x20)) {
    uVar6 = (long)&next->prev_foot + *(long *)((long)msp + 8);
    *(ulong *)((long)msp + 8) = uVar6;
    *(mstate *)((long)msp + 0x20) = fm;
    fm->dvsize = uVar6 | 1;
    *(ulong *)((long)fm->smallbins + (uVar6 - 0x48)) = uVar6;
    return;
  }
  uVar6 = pmVar5->dvsize;
  next = (mchunkptr)((long)&next->prev_foot + (uVar6 & 0xfffffffffffffff8));
  if (uVar6 >> 3 < 0x20) {
    pmVar1 = (malloc_tree_chunk *)pmVar5->topsize;
    pmVar2 = (malloc_tree_chunk *)pmVar5->least_addr;
    iVar3 = (int)(uVar6 >> 3);
    bVar12 = true;
    if ((pmVar1 != (malloc_tree_chunk *)((long)msp + (ulong)(uint)(iVar3 << 1) * 8 + 0x48)) &&
       (bVar12 = false, *(malloc_tree_chunk **)((long)msp + 0x18) <= pmVar1)) {
      bVar12 = (mstate)pmVar1->bk == pmVar5;
    }
    if (!bVar12) {
      abort();
    }
    if (pmVar2 == pmVar1) {
      *(uint *)msp = (1 << ((byte)(uVar6 >> 3) & 0x1f) ^ 0xffffffffU) & *msp;
    }
    else {
      bVar12 = true;
      if ((pmVar2 != (malloc_tree_chunk *)((long)msp + (ulong)(uint)(iVar3 << 1) * 8 + 0x48)) &&
         (bVar12 = false, *(malloc_tree_chunk **)((long)msp + 0x18) <= pmVar2)) {
        bVar12 = (mstate)pmVar2->fd == pmVar5;
      }
      if (!bVar12) {
        abort();
      }
      pmVar1->bk = pmVar2;
      pmVar2->fd = pmVar1;
    }
  }
  else {
    pmVar1 = (malloc_tree_chunk *)pmVar5->trim_check;
    if ((mstate)pmVar5->least_addr == pmVar5) {
      CP_1 = (tchunkptr *)&pmVar5->top;
      F_3 = (tchunkptr)pmVar5->top;
      if (F_3 == (tchunkptr)0x0) {
        CP_1 = (tchunkptr *)&pmVar5->dv;
        F_3 = (tchunkptr)pmVar5->dv;
        if (F_3 == (tchunkptr)0x0) goto LAB_0016da87;
      }
      while( true ) {
        H_1 = F_3->child + 1;
        bVar12 = true;
        if (F_3->child[1] == (malloc_tree_chunk *)0x0) {
          H_1 = F_3->child;
          bVar12 = F_3->child[0] != (malloc_tree_chunk *)0x0;
        }
        if (!bVar12) break;
        CP_1 = H_1;
        F_3 = *H_1;
      }
      if (CP_1 < *(tchunkptr **)((long)msp + 0x18)) {
        abort();
      }
      *CP_1 = (tchunkptr)0x0;
    }
    else {
      pmVar2 = (malloc_tree_chunk *)pmVar5->topsize;
      F_3 = (tchunkptr)pmVar5->least_addr;
      bVar12 = false;
      if ((*(malloc_tree_chunk **)((long)msp + 0x18) <= pmVar2) &&
         (bVar12 = false, (mstate)pmVar2->bk == pmVar5)) {
        bVar12 = (mstate)F_3->fd == pmVar5;
      }
      if (!bVar12) {
        abort();
      }
      pmVar2->bk = F_3;
      F_3->fd = pmVar2;
    }
LAB_0016da87:
    if (pmVar1 != (malloc_tree_chunk *)0x0) {
      puVar7 = (ulong *)((long)msp + (ulong)(uint)pmVar5->release_checks * 8 + 600);
      if (pmVar5 == (mstate)*puVar7) {
        *puVar7 = (ulong)F_3;
        if (F_3 == (tchunkptr)0x0) {
          *(uint *)((long)msp + 4) =
               (1 << ((byte)(bindex_t)pmVar5->release_checks & 0x1f) ^ 0xffffffffU) &
               *(uint *)((long)msp + 4);
        }
      }
      else {
        if (pmVar1 < *(malloc_tree_chunk **)((long)msp + 0x18)) {
          abort();
        }
        if ((mstate)pmVar1->child[0] == pmVar5) {
          pmVar1->child[0] = F_3;
        }
        else {
          pmVar1->child[1] = F_3;
        }
      }
      if (F_3 != (tchunkptr)0x0) {
        if (F_3 < *(tchunkptr *)((long)msp + 0x18)) {
          abort();
        }
        F_3->parent = pmVar1;
        pmVar1 = (malloc_tree_chunk *)pmVar5->dv;
        if (pmVar1 != (malloc_tree_chunk *)0x0) {
          if (pmVar1 < *(malloc_tree_chunk **)((long)msp + 0x18)) {
            abort();
          }
          F_3->child[0] = pmVar1;
          pmVar1->parent = F_3;
        }
        pmVar1 = (malloc_tree_chunk *)pmVar5->top;
        if (pmVar1 != (malloc_tree_chunk *)0x0) {
          if (pmVar1 < *(malloc_tree_chunk **)((long)msp + 0x18)) {
            abort();
          }
          F_3->child[1] = pmVar1;
          pmVar1->parent = F_3;
        }
      }
    }
  }
  fm->dvsize = (ulong)next | 1;
  *(mchunkptr *)((long)((malloc_state *)(fm->smallbins + -9))->smallbins + (long)&next[-3].bk) =
       next;
  if (fm == *(mstate *)((long)msp + 0x20)) {
    *(mchunkptr *)((long)msp + 8) = next;
    return;
  }
LAB_0016dcf2:
  if ((ulong)next >> 3 < 0x20) {
    pmVar8 = (tchunkptr)((long)msp + (ulong)(uint)((int)((ulong)next >> 3) << 1) * 8 + 0x48);
    bVar11 = (byte)((ulong)next >> 3);
    if ((*msp & 1 << (bVar11 & 0x1f)) == 0) {
      *(uint *)msp = 1 << (bVar11 & 0x1f) | *msp;
      tp = pmVar8;
    }
    else {
      if (pmVar8->fd < *(malloc_tree_chunk **)((long)msp + 0x18)) {
        abort();
      }
      tp = pmVar8->fd;
    }
    pmVar8->fd = (malloc_tree_chunk *)fm;
    tp->bk = (malloc_tree_chunk *)fm;
    fm->topsize = (size_t)tp;
    fm->least_addr = (char *)pmVar8;
  }
  else {
    uVar4 = (uint)((ulong)next >> 8);
    if (uVar4 == 0) {
      K = 0;
    }
    else if (uVar4 < 0x10000) {
      K = (0x1f - LZCOUNT(uVar4)) * 2 +
          ((uint)((ulong)next >> ((char)(0x1f - LZCOUNT(uVar4)) + 7U & 0x3f)) & 1);
    }
    else {
      K = 0x1f;
    }
    psVar9 = (size_t *)((long)msp + (ulong)K * 8 + 600);
    *(uint *)&fm->release_checks = K;
    fm->top = (mchunkptr)0x0;
    fm->dv = (mchunkptr)0x0;
    if ((*(uint *)((long)msp + 4) & 1 << ((byte)K & 0x1f)) == 0) {
      *(uint *)((long)msp + 4) = 1 << ((byte)K & 0x1f) | *(uint *)((long)msp + 4);
      *psVar9 = (size_t)fm;
      fm->trim_check = (size_t)psVar9;
      fm->least_addr = (char *)fm;
      fm->topsize = (size_t)fm;
    }
    else {
      K_1 = *psVar9;
      if (K == 0x1f) {
        bVar11 = 0;
      }
      else {
        bVar11 = 0x3f - ((char)(K >> 1) + '\x06');
      }
      C = (tchunkptr *)((long)next << (bVar11 & 0x3f));
      while ((mchunkptr)(*(ulong *)(K_1 + 8) & 0xfffffffffffffff8) != next) {
        psVar9 = (size_t *)(K_1 + 0x20 + ((long)C >> 0x3f) * -8);
        C = (tchunkptr *)((long)C << 1);
        if (*psVar9 == 0) {
          if (psVar9 < *(size_t **)((long)msp + 0x18)) {
            abort();
          }
          *psVar9 = (size_t)fm;
          fm->trim_check = K_1;
          fm->least_addr = (char *)fm;
          fm->topsize = (size_t)fm;
          goto LAB_0016e143;
        }
        K_1 = *psVar9;
      }
      uVar6 = *(ulong *)(K_1 + 0x10);
      bVar12 = false;
      if (*(ulong *)((long)msp + 0x18) <= K_1) {
        bVar12 = *(ulong *)((long)msp + 0x18) <= uVar6;
      }
      if (!bVar12) {
        abort();
      }
      *(mstate *)(uVar6 + 0x18) = fm;
      *(mstate *)(K_1 + 0x10) = fm;
      fm->topsize = uVar6;
      fm->least_addr = (char *)K_1;
      fm->trim_check = 0;
    }
LAB_0016e143:
    lVar10 = *(long *)((long)msp + 0x38) + -1;
    *(long *)((long)msp + 0x38) = lVar10;
    if (lVar10 == 0) {
      release_unused_segments((mstate)msp);
    }
  }
  return;
}

Assistant:

void mspace_free(mspace msp, void* mem) {
  if (mem != 0) {
    mchunkptr p  = mem2chunk(mem);
#if FOOTERS
    mstate fm = get_mstate_for(p);
    (void)msp; /* placate people compiling -Wunused */
#else /* FOOTERS */
    mstate fm = (mstate)msp;
#endif /* FOOTERS */
    if (!ok_magic(fm)) {
      USAGE_ERROR_ACTION(fm, p);
      return;
    }
    if (!PREACTION(fm)) {
      check_inuse_chunk(fm, p);
      if (RTCHECK(ok_address(fm, p) && ok_inuse(p))) {
        size_t psize = chunksize(p);
        mchunkptr next = chunk_plus_offset(p, psize);
        if (!pinuse(p)) {
          size_t prevsize = p->prev_foot;
          if (is_mmapped(p)) {
            psize += prevsize + MMAP_FOOT_PAD;
            if (CALL_MUNMAP((char*)p - prevsize, psize) == 0)
              fm->footprint -= psize;
            goto postaction;
          }
          else {
            mchunkptr prev = chunk_minus_offset(p, prevsize);
            psize += prevsize;
            p = prev;
            if (RTCHECK(ok_address(fm, prev))) { /* consolidate backward */
              if (p != fm->dv) {
                unlink_chunk(fm, p, prevsize);
              }
              else if ((next->head & INUSE_BITS) == INUSE_BITS) {
                fm->dvsize = psize;
                set_free_with_pinuse(p, psize, next);
                goto postaction;
              }
            }
            else
              goto erroraction;
          }
        }

        if (RTCHECK(ok_next(p, next) && ok_pinuse(next))) {
          if (!cinuse(next)) {  /* consolidate forward */
            if (next == fm->top) {
              size_t tsize = fm->topsize += psize;
              fm->top = p;
              p->head = tsize | PINUSE_BIT;
              if (p == fm->dv) {
                fm->dv = 0;
                fm->dvsize = 0;
              }
              if (should_trim(fm, tsize))
                sys_trim(fm, 0);
              goto postaction;
            }
            else if (next == fm->dv) {
              size_t dsize = fm->dvsize += psize;
              fm->dv = p;
              set_size_and_pinuse_of_free_chunk(p, dsize);
              goto postaction;
            }
            else {
              size_t nsize = chunksize(next);
              psize += nsize;
              unlink_chunk(fm, next, nsize);
              set_size_and_pinuse_of_free_chunk(p, psize);
              if (p == fm->dv) {
                fm->dvsize = psize;
                goto postaction;
              }
            }
          }
          else
            set_free_with_pinuse(p, psize, next);

          if (is_small(psize)) {
            insert_small_chunk(fm, p, psize);
            check_free_chunk(fm, p);
          }
          else {
            tchunkptr tp = (tchunkptr)p;
            insert_large_chunk(fm, tp, psize);
            check_free_chunk(fm, p);
            if (--fm->release_checks == 0)
              release_unused_segments(fm);
          }
          goto postaction;
        }
      }
    erroraction:
      USAGE_ERROR_ACTION(fm, p);
    postaction:
      POSTACTION(fm);
    }
  }
}